

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# troff_display_driver.cpp
# Opt level: O2

void __thiscall TroffDisplayDriver::display(TroffDisplayDriver *this,Document *doc,ostream *output)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  long *plVar5;
  ostream *poVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  string local_50 [32];
  
  uVar14 = 0;
  do {
    uVar4 = Document::size();
    if (uVar4 <= uVar14) {
      return;
    }
    plVar5 = (long *)Document::operator[]((ulong)doc);
    uVar2 = (**(code **)(*plVar5 + 8))(plVar5);
    switch(uVar2) {
    case 1:
      pcVar13 = ".TH ";
      break;
    case 2:
      pcVar13 = ".SH ";
      break;
    case 3:
      pcVar13 = ".SS ";
      break;
    default:
      pcVar13 = ".PP";
      poVar6 = output;
      goto LAB_0012bbfb;
    case 8:
      poVar6 = std::operator<<(output,".TP");
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      pcVar13 = ".BR ";
LAB_0012bbfb:
      poVar6 = std::operator<<(poVar6,pcVar13);
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_0012bc08;
    }
    std::operator<<(output,pcVar13);
LAB_0012bc08:
    for (uVar4 = 0; uVar7 = Paragraph::size(), uVar4 < uVar7; uVar4 = uVar4 + 1) {
      plVar8 = (long *)Paragraph::operator[]((ulong)plVar5);
      if (plVar8 == (long *)0x0) {
        bVar15 = true;
        lVar9 = 0;
        bVar1 = false;
LAB_0012bd3e:
        (**(code **)(*plVar8 + 0x10))(local_50,plVar8);
        std::operator<<(output,local_50);
        std::__cxx11::string::~string(local_50);
      }
      else {
        lVar9 = __dynamic_cast(plVar8,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
        lVar10 = __dynamic_cast(plVar8,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
        lVar11 = __dynamic_cast(plVar8,&LineElement::typeinfo,&CodeLineElement::typeinfo);
        lVar12 = __dynamic_cast(plVar8,&LineElement::typeinfo,&UrlLineElement::typeinfo);
        bVar1 = lVar10 != 0;
        if (lVar10 == 0) {
          if (lVar9 != 0) {
            pcVar13 = "\\fB";
            goto LAB_0012bce4;
          }
          if (lVar11 != 0) {
            (**(code **)(*plVar5 + 8))();
          }
          lVar9 = 0;
        }
        else {
          pcVar13 = "\\fI";
LAB_0012bce4:
          std::operator<<(output,pcVar13);
        }
        bVar15 = lVar11 == 0;
        if (lVar12 == 0) goto LAB_0012bd3e;
        poVar6 = std::endl<char,std::char_traits<char>>(output);
        poVar6 = std::operator<<(poVar6,".IR ");
        UrlLineElement::url_abi_cxx11_();
        poVar6 = std::operator<<(poVar6,local_50);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string(local_50);
      }
      if ((bool)(lVar9 != 0 | bVar1)) {
        std::operator<<(output,"\\fR");
      }
      else if (!bVar15) {
        (**(code **)(*plVar5 + 8))(plVar5);
      }
    }
    uVar3 = (**(code **)(*plVar5 + 8))(plVar5);
    if ((uVar3 & 0xfffffffe) != 10) {
      std::endl<char,std::char_traits<char>>(output);
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void TroffDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		is_quotation(false),
		is_ulist(false);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << ".TH ";
				break;
			case Paragraph::Level::Title2:
				output << ".SH ";
				break;
			case Paragraph::Level::Title3:
				output << ".SS ";
				break;
			case Paragraph::Level::UList1:
				output << ".TP" << endl << ".BR " << endl;
				break;
			case Paragraph::Level::Code:
			case Paragraph::Level::Quote:
			default:
				output << ".PP" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "\\fI";
			} else if (bold_le) {
				output << "\\fB";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
			
			if (url_le) {
				output << endl << ".IR " << url_le->url() << endl;
			} else {
				output << l->content();
			}

			if (italic_le or bold_le) {
				output << "\\fR";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				break;
			case Paragraph::Level::Quote:
				break;
			case Paragraph::Level::UList1:
			case Paragraph::Level::Title1:
			case Paragraph::Level::Title2:
			default:
				output << endl;
				break;
		}
	}
}